

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstracttextdocumentlayout.cpp
# Opt level: O2

void QAbstractTextDocumentLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined4 uVar4;
  long in_FS_OFFSET;
  undefined8 in_XMM1_Qa;
  QRectF local_38;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractTextDocumentLayout::*)(QRectF_const&)>
                      ((QtMocHelpers *)_a,(void **)update,0,0);
    if (((!bVar3) &&
        (bVar3 = QtMocHelpers::
                 indexOfMethod<void(QAbstractTextDocumentLayout::*)(QTextBlock_const&)>
                           ((QtMocHelpers *)_a,(void **)updateBlock,0,2), !bVar3)) &&
       (bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractTextDocumentLayout::*)(QSizeF_const&)>
                          ((QtMocHelpers *)_a,(void **)documentSizeChanged,0,3), !bVar3)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QtMocHelpers::indexOfMethod<void(QAbstractTextDocumentLayout::*)(int)>
                  ((QtMocHelpers *)_a,(void **)pageCountChanged,0,4);
        return;
      }
      goto LAB_0040cfdb;
    }
    goto switchD_0040ce68_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0040ce68_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      update((QAbstractTextDocumentLayout *)_o,(QRectF *)_a[1]);
      return;
    }
    goto LAB_0040cfdb;
  case 1:
    local_38.xp = 0.0;
    local_38.yp = 0.0;
    local_38.w = 1000000000.0;
    local_38.h = 1000000000.0;
    update((QAbstractTextDocumentLayout *)_o,&local_38);
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      updateBlock((QAbstractTextDocumentLayout *)_o,(QTextBlock *)_a[1]);
      return;
    }
    goto LAB_0040cfdb;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      documentSizeChanged((QAbstractTextDocumentLayout *)_o,(QSizeF *)_a[1]);
      return;
    }
    goto LAB_0040cfdb;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      pageCountChanged((QAbstractTextDocumentLayout *)_o,*_a[1]);
      return;
    }
    goto LAB_0040cfdb;
  case 5:
    uVar4 = (**(code **)(**(long **)(*(long *)(_o + 8) + 8) + 0x70))();
    if ((undefined4 *)*_a != (undefined4 *)0x0) {
      *(undefined4 *)*_a = uVar4;
    }
    break;
  case 6:
    uVar2 = (**(code **)(**(long **)(*(long *)(_o + 8) + 8) + 0x78))();
    puVar1 = (undefined8 *)*_a;
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = uVar2;
      puVar1[1] = in_XMM1_Qa;
    }
  }
switchD_0040ce68_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_0040cfdb:
  __stack_chk_fail();
}

Assistant:

void QAbstractTextDocumentLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractTextDocumentLayout *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->update((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 1: _t->update(); break;
        case 2: _t->updateBlock((*reinterpret_cast< std::add_pointer_t<QTextBlock>>(_a[1]))); break;
        case 3: _t->documentSizeChanged((*reinterpret_cast< std::add_pointer_t<QSizeF>>(_a[1]))); break;
        case 4: _t->pageCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: { int _r = _t->d_func()->_q_dynamicPageCountSlot();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 6: { QSizeF _r = _t->d_func()->_q_dynamicDocumentSizeSlot();
            if (_a[0]) *reinterpret_cast< QSizeF*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QRectF & )>(_a, &QAbstractTextDocumentLayout::update, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QTextBlock & )>(_a, &QAbstractTextDocumentLayout::updateBlock, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QSizeF & )>(_a, &QAbstractTextDocumentLayout::documentSizeChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(int )>(_a, &QAbstractTextDocumentLayout::pageCountChanged, 4))
            return;
    }
}